

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  AlphaNum *in_R8;
  string delimiter;
  string local_e0;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  
  iVar3 = this->recursion_limit_;
  this->recursion_limit_ = iVar3 + -1;
  if (iVar3 < 1) {
    local_e0._M_dataplus._M_p =
         "Message is too deep, the parser exceeded the configured recursion limit of ";
    local_e0._M_string_length = 0x4b;
    pcVar5 = local_b0.digits;
    local_b0.piece_data_ = pcVar5;
    pcVar4 = FastInt32ToBufferLeft(this->initial_recursion_limit_,pcVar5);
    local_b0.piece_size_ = (long)pcVar4 - (long)pcVar5;
    local_80.piece_data_ = ".";
    local_80.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_50,(protobuf *)&local_e0,&local_b0,&local_80,in_R8);
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    bVar2 = false;
  }
  else {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    bVar2 = ConsumeMessageDelimiter(this,&local_e0);
    if (bVar2) {
      do {
        local_b0.piece_data_ = local_b0.digits;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,">","");
        pcVar5 = local_b0.piece_data_;
        sVar1 = (this->tokenizer_).current_.text._M_string_length;
        if ((sVar1 == local_b0.piece_size_) &&
           ((sVar1 == 0 ||
            (iVar3 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_b0.piece_data_,
                          sVar1), iVar3 == 0)))) {
          bVar2 = false;
        }
        else {
          local_80.piece_data_ = local_80.digits;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"}","");
          pcVar4 = local_80.piece_data_;
          sVar1 = (this->tokenizer_).current_.text._M_string_length;
          if (sVar1 == local_80.piece_size_) {
            if (sVar1 == 0) {
              bVar2 = false;
            }
            else {
              iVar3 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_80.piece_data_,
                           sVar1);
              bVar2 = iVar3 != 0;
            }
          }
          else {
            bVar2 = true;
          }
          pcVar5 = local_b0.piece_data_;
          if (pcVar4 != local_80.digits) {
            operator_delete(pcVar4);
            pcVar5 = local_b0.piece_data_;
          }
        }
        if (pcVar5 != local_b0.digits) {
          operator_delete(pcVar5);
        }
        if (!bVar2) {
          bVar2 = Consume(this,&local_e0);
          if (bVar2) {
            this->recursion_limit_ = this->recursion_limit_ + 1;
            bVar2 = true;
            goto LAB_003b53e0;
          }
          break;
        }
        bVar2 = SkipField(this);
      } while (bVar2);
    }
    bVar2 = false;
LAB_003b53e0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
  }
  return bVar2;
}

Assistant:

bool SkipFieldMessage() {
    if (--recursion_limit_ < 0) {
      ReportError(
          StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));

    ++recursion_limit_;
    return true;
  }